

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O2

int __thiscall xercesc_4_0::XMLDateTime::fillYearString(XMLDateTime *this,XMLCh **ptr,int value)

{
  XMLCh XVar1;
  XMLSize_t XVar2;
  int iVar3;
  XMLCh *pXVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  XMLCh strBuffer [16];
  
  XMLString::binToText(value,strBuffer,0xf,10,this->fMemoryManager);
  XVar2 = XMLString::stringLen(strBuffer);
  pXVar4 = *ptr;
  if (strBuffer[0] == L'-') {
    *ptr = pXVar4 + 1;
    *pXVar4 = L'-';
    pXVar4 = pXVar4 + 1;
  }
  uVar5 = (ulong)(strBuffer[0] == L'-');
  if (uVar5 + XVar2 < 4) {
    lVar6 = (uVar5 - XVar2) + 4;
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      *ptr = pXVar4 + 1;
      *pXVar4 = L'0';
      pXVar4 = pXVar4 + 1;
    }
  }
  for (; uVar5 < XVar2; uVar5 = uVar5 + 1) {
    XVar1 = strBuffer[uVar5];
    *ptr = pXVar4 + 1;
    *pXVar4 = XVar1;
    pXVar4 = pXVar4 + 1;
  }
  iVar3 = 0;
  if (4 < XVar2) {
    iVar3 = (int)XVar2 + -4;
  }
  return iVar3;
}

Assistant:

int XMLDateTime::fillYearString(XMLCh*& ptr, int value) const
{
    XMLCh strBuffer[16];
    // let's hope we get no years of 15 digits...
    XMLString::binToText(value, strBuffer, 15, 10, fMemoryManager);
    XMLSize_t actualLen = XMLString::stringLen(strBuffer);
    // don't forget that years can be negative...
    XMLSize_t negativeYear = 0;
    if(strBuffer[0] == chDash)
    {
        *ptr++ = strBuffer[0];
        negativeYear = 1;
    }
    XMLSize_t i;
    //append leading zeros
    if(actualLen+negativeYear < 4)
        for (i = 0; i < 4 - actualLen+negativeYear; i++)
            *ptr++ = chDigit_0;

    for (i = negativeYear; i < actualLen; i++)
        *ptr++ = strBuffer[i];

    if(actualLen > 4)
        return (int)actualLen-4;
    return 0;
}